

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_seti(lua_State *L,int idx,lua_Integer n)

{
  Table *t_00;
  TValue *t_01;
  ulong uVar1;
  TValue *io;
  TValue temp;
  lu_byte *tag;
  lua_Unsigned u;
  Table *h;
  int hres;
  TValue *t;
  lua_Integer n_local;
  int idx_local;
  lua_State *L_local;
  
  t_01 = index2value(L,idx);
  if (t_01->tt_ == 'E') {
    t_00 = (Table *)(t_01->value_).f;
    uVar1 = n - 1;
    if (uVar1 < t_00->asize) {
      temp._8_8_ = (long)t_00->array + n + 3;
      if (((t_00->metatable == (Table *)0x0) || ((t_00->metatable->flags & 2) != 0)) ||
         ((*(byte *)temp._8_8_ & 0xf) != 0)) {
        *(byte *)temp._8_8_ = *(byte *)((L->top).offset + -8);
        t_00->array[-1 - uVar1] = *(Value *)((L->top).offset + -0x10);
        h._4_4_ = 0;
      }
      else {
        h._4_4_ = (uint)uVar1 ^ 0xffffffff;
      }
    }
    else {
      h._4_4_ = luaH_psetint(t_00,n,(TValue *)((L->top).offset + -0x10));
    }
  }
  else {
    h._4_4_ = 2;
  }
  if (h._4_4_ == 0) {
    if ((((*(byte *)((L->top).offset + -8) & 0x40) != 0) &&
        ((((t_01->value_).gc)->marked & 0x20) != 0)) &&
       ((*(byte *)(*(long *)((L->top).offset + -0x10) + 9) & 0x18) != 0)) {
      luaC_barrierback_(L,(t_01->value_).gc);
    }
  }
  else {
    temp.value_.ub = '\x03';
    io = (TValue *)n;
    luaV_finishset(L,t_01,(TValue *)&io,(TValue *)((L->top).offset + -0x10),h._4_4_);
  }
  (L->top).p = (StkId)((L->top).offset + -0x10);
  return;
}

Assistant:

LUA_API void lua_seti (lua_State *L, int idx, lua_Integer n) {
  TValue *t;
  int hres;
  lua_lock(L);
  api_checkpop(L, 1);
  t = index2value(L, idx);
  luaV_fastseti(t, n, s2v(L->top.p - 1), hres);
  if (hres == HOK)
    luaV_finishfastset(L, t, s2v(L->top.p - 1));
  else {
    TValue temp;
    setivalue(&temp, n);
    luaV_finishset(L, t, &temp, s2v(L->top.p - 1), hres);
  }
  L->top.p--;  /* pop value */
  lua_unlock(L);
}